

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

void __thiscall
rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::SetStringRaw
          (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,StringRefType *s,
          CrtAllocator *allocator)

{
  bool bVar1;
  Ch *pCVar2;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *local_28;
  Ch *str;
  CrtAllocator *allocator_local;
  StringRefType *s_local;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this_local;
  
  bVar1 = ShortString::Usable(s->length);
  if (bVar1) {
    (this->data_).f.flags = 0x1c05;
    ShortString::SetLength((ShortString *)this,s->length);
    pCVar2 = GenericStringRef::operator_cast_to_char_((GenericStringRef *)s);
    memmove(this,pCVar2,(ulong)s->length);
    local_28 = this;
  }
  else {
    (this->data_).f.flags = 0xc05;
    (this->data_).s.length = s->length;
    local_28 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
               CrtAllocator::Malloc(allocator,(ulong)(s->length + 1));
    SetStringPointer(this,(Ch *)local_28);
    pCVar2 = GenericStringRef::operator_cast_to_char_((GenericStringRef *)s);
    memcpy(local_28,pCVar2,(ulong)s->length);
  }
  *(Ch *)((long)&local_28->data_ + (ulong)s->length) = '\0';
  return;
}

Assistant:

void SetStringRaw(StringRefType s, Allocator& allocator) {
        Ch* str = 0;
        if (ShortString::Usable(s.length)) {
            data_.f.flags = kShortStringFlag;
            data_.ss.SetLength(s.length);
            str = data_.ss.str;
            std::memmove(str, s, s.length * sizeof(Ch));
        } else {
            data_.f.flags = kCopyStringFlag;
            data_.s.length = s.length;
            str = static_cast<Ch *>(allocator.Malloc((s.length + 1) * sizeof(Ch)));
            SetStringPointer(str);
            std::memcpy(str, s, s.length * sizeof(Ch));
        }
        str[s.length] = '\0';
    }